

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O3

void __thiscall EnrichableI2cAnalyzer::RecordStartStopBit(EnrichableI2cAnalyzer *this)

{
  EnrichableI2cAnalyzerResults *pEVar1;
  int iVar2;
  MarkerType MVar3;
  
  iVar2 = AnalyzerChannelData::GetBitState();
  pEVar1 = (this->mResults)._M_ptr;
  MVar3 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerResults::AddMarker((ulonglong)pEVar1,MVar3,(Channel *)(ulong)(9 - (iVar2 == 0)));
  this->mNeedAddress = true;
  AnalyzerResults::CommitPacketAndStartNewPacket();
  AnalyzerResults::CommitResults();
  return;
}

Assistant:

void EnrichableI2cAnalyzer::RecordStartStopBit()
{
	if( mSda->GetBitState() == BIT_LOW )
	{
		//negedge -> START / restart
		mResults->AddMarker( mSda->GetSampleNumber(), AnalyzerResults::Start, mSettings->mSdaChannel );
	}else
	{
		//posedge -> STOP
		mResults->AddMarker( mSda->GetSampleNumber(), AnalyzerResults::Stop, mSettings->mSdaChannel );
	}
	
	mNeedAddress = true;
	mResults->CommitPacketAndStartNewPacket();
	mResults->CommitResults( );

}